

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O3

void __thiscall csm::MIC::Data::setValue(Data *this,string *value,bool clearPrevious)

{
  size_t __n;
  char *__dest;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,clearPrevious) != 0) {
    clear(this);
  }
  this->theType = STRING_TYPE;
  (this->field_1).field_0.theStr = (char *)0x0;
  __n = value->_M_string_length;
  (this->field_1).field_0.theLen = __n;
  if (__n != 0) {
    __dest = (char *)operator_new__(__n + 1);
    (this->field_1).field_0.theStr = __dest;
    strncpy(__dest,(value->_M_dataplus)._M_p,__n);
    __dest[__n] = '\0';
  }
  return;
}

Assistant:

void Data::setValue(const std::string& value,bool clearPrevious)
{
   if (clearPrevious) clear();
   
   theType = STRING_TYPE;
   theStr  = 0;
   theLen  = value.length();
   
   if (theLen)
   {
      theStr = new char[theLen + 1];
      strncpy(theStr,value.c_str(), theLen);
      theStr[theLen] = '\0';
   }
}